

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawGem::Draw(CommandDrawGem *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  FTexture *texture;
  FTexture *texture_00;
  uint uVar1;
  SBarInfoCoordinate y;
  int iVar2;
  
  texture = FImageCollection::operator[](&statusBar->Images,this->chain);
  texture_00 = FImageCollection::operator[](&statusBar->Images,this->gem);
  if (texture != (FTexture *)0x0) {
    iVar2 = this->chainWiggle * 2;
    if (this->drawValue == this->goalValue) {
      iVar2 = 0;
    }
    if (this->wiggle == false) {
      iVar2 = 0;
    }
    y = (SBarInfoCoordinate)(iVar2 + (int)this->y);
    uVar1 = (uint)((double)((uint)texture->Width * 2) / (texture->Scale).X);
    uVar1 = (uint)((double)this->drawValue *
                  ((double)(int)(((uVar1 & 1) - (this->rightPadding + this->leftPadding)) +
                                ((int)uVar1 >> 1)) / 100.0));
    DSBarInfo::DrawGraphic
              (statusBar,texture,(SBarInfoCoordinate)((uVar1 % this->chainSize) * 2 + (int)this->x),
               y,block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets);
    if (texture_00 != (FTexture *)0x0) {
      DSBarInfo::DrawGraphic
                (statusBar,texture_00,
                 (SBarInfoCoordinate)((uVar1 + this->leftPadding) * 2 + (int)this->x),y,
                 block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			FTexture *chainImg = statusBar->Images[chain];
			FTexture *gemImg = statusBar->Images[gem];
			if(chainImg == NULL)
				return;
		
			SBarInfoCoordinate drawY = y;
			if(wiggle && drawValue != goalValue) // Should only wiggle when the value doesn't equal what is being drawn.
				drawY += chainWiggle;
			int chainWidth = chainImg->GetScaledWidth();
			int offset = (int) (((double) (chainWidth-leftPadding-rightPadding)/100)*drawValue);
			statusBar->DrawGraphic(chainImg, x+(offset%chainSize), drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
			if(gemImg != NULL)
				statusBar->DrawGraphic(gemImg, x+leftPadding+offset, drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), translatable);
		}